

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O2

bool __thiscall cmCTestVC::Update(cmCTestVC *this)

{
  cmCTest *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  this_00 = this->CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"UpdateVersionOnly",&local_61);
  cmCTest::GetCTestConfiguration(&local_60,this_00,&local_40);
  bVar1 = cmSystemTools::IsOn(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  bVar4 = 1;
  if (!bVar1) {
    iVar2 = (*this->_vptr_cmCTestVC[3])(this);
    std::operator<<(this->Log,"--- Begin Update ---\n");
    iVar3 = (*this->_vptr_cmCTestVC[4])(this);
    bVar4 = (byte)iVar3 & (byte)iVar2;
    std::operator<<(this->Log,"--- End Update ---\n");
  }
  iVar2 = (*this->_vptr_cmCTestVC[5])(this);
  return (bool)((byte)iVar2 & bVar4);
}

Assistant:

bool cmCTestVC::Update()
{
  bool result = true;
  // if update version only is on then do not actually update,
  // just note the current version and finish
  if (!cmSystemTools::IsOn(
        this->CTest->GetCTestConfiguration("UpdateVersionOnly"))) {
    result = this->NoteOldRevision() && result;
    this->Log << "--- Begin Update ---\n";
    result = this->UpdateImpl() && result;
    this->Log << "--- End Update ---\n";
  }
  result = this->NoteNewRevision() && result;
  return result;
}